

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O0

LocalVector<unsigned_int> * __thiscall
limonp::LocalVector<unsigned_int>::operator=
          (LocalVector<unsigned_int> *this,LocalVector<unsigned_int> *vec)

{
  uint *__src;
  size_t sVar1;
  uint *puVar2;
  LocalVector<unsigned_int> *vec_local;
  LocalVector<unsigned_int> *this_local;
  
  clear(this);
  sVar1 = size(vec);
  this->size_ = sVar1;
  sVar1 = capacity(vec);
  this->capacity_ = sVar1;
  if (vec == (LocalVector<unsigned_int> *)vec->ptr_) {
    memcpy(this,vec,this->size_ << 2);
    this->ptr_ = this->buffer_;
  }
  else {
    sVar1 = capacity(vec);
    puVar2 = (uint *)malloc(sVar1 << 2);
    this->ptr_ = puVar2;
    if (this->ptr_ == (uint *)0x0) {
      __assert_fail("ptr_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/limonp/LocalVector.hpp"
                    ,0x3e,
                    "LocalVector<T> &limonp::LocalVector<unsigned int>::operator=(const LocalVector<T> &) [T = unsigned int]"
                   );
    }
    puVar2 = this->ptr_;
    __src = vec->ptr_;
    sVar1 = size(vec);
    memcpy(puVar2,__src,sVar1 << 2);
  }
  return this;
}

Assistant:

LocalVector<T>& operator = (const LocalVector<T>& vec) {
    clear();
    size_ = vec.size();
    capacity_ = vec.capacity();
    if(vec.buffer_ == vec.ptr_) {
      memcpy(buffer_, vec.buffer_, sizeof(T) * size_);
      ptr_ = buffer_;
    } else {
      ptr_ = (T*) malloc(vec.capacity() * sizeof(T));
      assert(ptr_);
      memcpy(ptr_, vec.ptr_, vec.size() * sizeof(T));
    }
    return *this;
  }